

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall QToolBarAreaLayout::QToolBarAreaLayout(QToolBarAreaLayout *this,QMainWindow *win)

{
  long lVar1;
  QToolBarAreaLayoutInfo *pQVar2;
  QToolBarAreaLayoutInfo *pQVar3;
  qsizetype in_RSI;
  QToolBarAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  DockPosition pos;
  int i;
  QToolBarAreaLayoutInfo *local_60;
  int local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::QRect((QRect *)in_RDI);
  (in_RDI->lines).d.size = in_RSI;
  pQVar2 = in_RDI + 4;
  pQVar3 = (QToolBarAreaLayoutInfo *)&in_RDI->rect;
  do {
    local_60 = pQVar3;
    QToolBarAreaLayoutInfo::QToolBarAreaLayoutInfo(in_RDI,(DockPosition)((ulong)local_60 >> 0x20));
    pQVar3 = local_60 + 1;
  } while (local_60 + 1 != (QToolBarAreaLayoutInfo *)&pQVar2->rect);
  *(undefined1 *)&in_RDI[4].rect.x1.m_i = 1;
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    QToolBarAreaLayoutInfo::QToolBarAreaLayoutInfo(in_RDI,(DockPosition)((ulong)local_60 >> 0x20));
    QToolBarAreaLayoutInfo::operator=(in_RDI,local_60);
    QToolBarAreaLayoutInfo::~QToolBarAreaLayoutInfo((QToolBarAreaLayoutInfo *)0x6f2659);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBarAreaLayout::QToolBarAreaLayout(const QMainWindow *win) : mainWindow(win), visible(true)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QInternal::DockPosition pos = static_cast<QInternal::DockPosition>(i);
        docks[i] = QToolBarAreaLayoutInfo(pos);
    }
}